

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::PlainGatherDepthCube::TextBody_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  void *local_18;
  PlainGatherDepthCube *this_local;
  
  local_18 = this;
  this_local = (PlainGatherDepthCube *)__return_storage_ptr__;
  (**(code **)(*this + 0xb8))();
  std::operator+(__return_storage_ptr__,&local_38,
                 " test_function(vec4 p) {                                \n    return textureGather(my_sampler, vec3(p.x, p.y, p.z), p.w);  \n}\n"
                );
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string TextBody()
	{
		return Type() + " test_function(vec4 p) {                                \n"
						"    return textureGather(my_sampler, vec3(p.x, p.y, p.z), p.w);  \n"
						"}\n";
	}